

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

double luby(double y,int x)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  int seq;
  int size;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_14 = 0;
  for (local_10 = 1; local_c = in_EDI, local_10 < in_EDI + 1; local_10 = local_10 * 2 + 1) {
    local_14 = local_14 + 1;
  }
  for (; local_10 + -1 != local_c; local_c = local_c % local_10) {
    local_10 = local_10 + -1 >> 1;
    local_14 = local_14 + -1;
  }
  dVar1 = pow(in_XMM0_Qa,(double)local_14);
  return dVar1;
}

Assistant:

static double luby(double y, int x){

    // Find the finite subsequence that contains index 'x', and the
    // size of that subsequence:
    int size, seq;
    for (size = 1, seq = 0; size < x+1; seq++, size = 2*size+1);

    while (size-1 != x){
        size = (size-1)>>1;
        seq--;
        x = x % size;
    }

    return pow(y, seq);
}